

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O0

void __thiscall icu_63::RBBINode::RBBINode(RBBINode *this,NodeType t)

{
  UVector *pUVar1;
  undefined4 in_register_00000034;
  UErrorCode *status_00;
  UVector *local_88;
  UVector *local_78;
  UVector *local_58;
  UErrorCode local_18;
  NodeType local_14;
  UErrorCode status;
  NodeType t_local;
  RBBINode *this_local;
  
  status_00 = (UErrorCode *)CONCAT44(in_register_00000034,t);
  local_14 = t;
  _status = this;
  UnicodeString::UnicodeString(&this->fText);
  this->fType = local_14;
  this->fParent = (RBBINode *)0x0;
  this->fLeftChild = (RBBINode *)0x0;
  this->fRightChild = (RBBINode *)0x0;
  this->fInputSet = (UnicodeSet *)0x0;
  this->fFirstPos = 0;
  this->fLastPos = 0;
  this->fNullable = '\0';
  this->fLookAheadEnd = '\0';
  this->fRuleRoot = '\0';
  this->fChainIn = '\0';
  this->fVal = 0;
  this->fPrecedence = precZero;
  local_18 = U_ZERO_ERROR;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
  local_58 = (UVector *)0x0;
  if (pUVar1 != (UVector *)0x0) {
    status_00 = &local_18;
    UVector::UVector(pUVar1,status_00);
    local_58 = pUVar1;
  }
  this->fFirstPosSet = local_58;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
  local_78 = (UVector *)0x0;
  if (pUVar1 != (UVector *)0x0) {
    status_00 = &local_18;
    UVector::UVector(pUVar1,status_00);
    local_78 = pUVar1;
  }
  this->fLastPosSet = local_78;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
  local_88 = (UVector *)0x0;
  if (pUVar1 != (UVector *)0x0) {
    UVector::UVector(pUVar1,&local_18);
    local_88 = pUVar1;
  }
  this->fFollowPos = local_88;
  if (local_14 == opCat) {
    this->fPrecedence = precOpCat;
  }
  else if (local_14 == opOr) {
    this->fPrecedence = precOpOr;
  }
  else if (local_14 == opStart) {
    this->fPrecedence = precStart;
  }
  else if (local_14 == opLParen) {
    this->fPrecedence = precLParen;
  }
  return;
}

Assistant:

RBBINode::RBBINode(NodeType t) : UMemory() {
#ifdef RBBI_DEBUG
    fSerialNum    = ++gLastSerial;
#endif
    fType         = t;
    fParent       = NULL;
    fLeftChild    = NULL;
    fRightChild   = NULL;
    fInputSet     = NULL;
    fFirstPos     = 0;
    fLastPos      = 0;
    fNullable     = FALSE;
    fLookAheadEnd = FALSE;
    fRuleRoot     = FALSE;
    fChainIn      = FALSE;
    fVal          = 0;
    fPrecedence   = precZero;

    UErrorCode     status = U_ZERO_ERROR;
    fFirstPosSet  = new UVector(status);  // TODO - get a real status from somewhere
    fLastPosSet   = new UVector(status);
    fFollowPos    = new UVector(status);
    if      (t==opCat)    {fPrecedence = precOpCat;}
    else if (t==opOr)     {fPrecedence = precOpOr;}
    else if (t==opStart)  {fPrecedence = precStart;}
    else if (t==opLParen) {fPrecedence = precLParen;}

}